

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

bool __thiscall QProcessPrivate::_q_canWrite(QProcessPrivate *this)

{
  bool bVar1;
  bool bVar2;
  QRingBufferRef *in_RDI;
  bool writeSucceeded;
  QRingBufferRef *pQVar3;
  undefined1 enable;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pQVar3 = in_RDI;
  bVar1 = QIODevicePrivate::QRingBufferRef::isEmpty(in_RDI);
  enable = (undefined1)((ulong)pQVar3 >> 0x38);
  if (bVar1) {
    if (in_RDI[0x35].m_buf != (QRingBuffer *)0x0) {
      QSocketNotifier::setEnabled
                ((QSocketNotifier *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                 (bool)enable);
    }
    bVar1 = false;
  }
  else {
    bVar1 = writeToStdin(this);
    bVar2 = QIODevicePrivate::QRingBufferRef::isEmpty(in_RDI);
    if ((bVar2) && (((ulong)in_RDI[0x37].m_buf & 0x100) != 0)) {
      closeWriteChannel((QProcessPrivate *)0x7a25b4);
    }
    else if (in_RDI[0x35].m_buf != (QRingBuffer *)0x0) {
      QIODevicePrivate::QRingBufferRef::isEmpty(in_RDI);
      QSocketNotifier::setEnabled
                ((QSocketNotifier *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                 (bool)enable);
    }
  }
  return bVar1;
}

Assistant:

bool QProcessPrivate::_q_canWrite()
{
    if (writeBuffer.isEmpty()) {
        if (stdinChannel.notifier)
            stdinChannel.notifier->setEnabled(false);
#if defined QPROCESS_DEBUG
        qDebug("QProcessPrivate::canWrite(), not writing anything (empty write buffer).");
#endif
        return false;
    }

    const bool writeSucceeded = writeToStdin();

    if (writeBuffer.isEmpty() && stdinChannel.closed)
        closeWriteChannel();
    else if (stdinChannel.notifier)
        stdinChannel.notifier->setEnabled(!writeBuffer.isEmpty());

    return writeSucceeded;
}